

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  bool bVar1;
  value_type *obj;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  const_iterator *in_stack_fffffffffffff908;
  undefined8 uVar5;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff910;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  uint *in_stack_fffffffffffff918;
  int iVar6;
  uint *lhs;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff920;
  char *rhs_expression;
  char *in_stack_fffffffffffff928;
  int line;
  char *lhs_expression;
  char *in_stack_fffffffffffff930;
  char *file;
  undefined8 in_stack_fffffffffffff938;
  Type TVar8;
  undefined8 uVar7;
  AssertHelper *in_stack_fffffffffffff940;
  AssertHelper *this_01;
  char *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  char *in_stack_fffffffffffff980;
  AssertionResult *in_stack_fffffffffffff988;
  AssertHelper *in_stack_fffffffffffff990;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9a0;
  key_type *in_stack_fffffffffffff9a8;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9d8;
  char *in_stack_fffffffffffff9e0;
  const_nonempty_iterator in_stack_fffffffffffff9f0;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa30;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined1 in_stack_fffffffffffffa70 [24];
  iterator in_stack_fffffffffffffa88;
  undefined1 local_530 [56];
  Message *pMStack_4f8;
  AssertHelper *local_4f0;
  undefined1 local_4e8 [80];
  undefined1 local_498 [8];
  AssertHelper *pAStack_490;
  uint *local_488;
  char *pcStack_480;
  char *local_478;
  char *pcStack_470;
  undefined8 local_468;
  Type TStack_464;
  AssertHelper *pAStack_460;
  size_type local_440;
  undefined4 local_434;
  AssertionResult local_430 [6];
  value_type local_3c8;
  int local_3bc;
  size_type local_3a8;
  undefined4 local_39c;
  AssertionResult local_398;
  undefined8 local_388;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_380;
  uint *local_378;
  char *pcStack_370;
  char *local_368;
  char *pcStack_360;
  undefined8 local_358;
  AssertHelper *pAStack_350;
  string local_340 [135];
  undefined1 local_2b9;
  AssertionResult local_2b8;
  key_type local_2a8;
  undefined1 local_2a0 [96];
  size_type local_240;
  undefined4 local_234;
  AssertionResult local_230 [2];
  key_type local_210;
  size_type local_208;
  undefined4 local_1fc;
  AssertionResult local_1f8 [2];
  size_type local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8 [2];
  key_type local_1a8;
  size_type local_1a0;
  undefined4 local_194;
  AssertionResult local_190 [2];
  size_type local_170;
  undefined4 local_164;
  AssertionResult local_160 [2];
  key_type local_140;
  size_type local_138;
  undefined4 local_12c;
  AssertionResult local_128 [6];
  value_type local_c0;
  value_type local_60;
  key_type local_38;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_10;
  
  TVar8 = (Type)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_10 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  local_24 = 0;
  obj = (value_type *)(in_RDI + 0x10);
  local_38 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffffa30 =
         (BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xea0905);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea0968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea09d9);
  local_60 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff910,
                            (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa50,obj);
  local_c0 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff910,
                            (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa50,obj);
  local_12c = 1;
  local_140 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
  ;
  local_138 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xea0b27);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea0b8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea0bf8);
  local_164 = 1;
  local_170 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea0c14);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xea0c8d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea0cf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea0d61);
  local_194 = 0;
  local_1a8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
  ;
  local_1a0 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xea0e23);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea0e86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea0ef4);
  local_1cc = 1;
  local_1d8 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea0f10);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9f0 =
         (const_nonempty_iterator)
         testing::AssertionResult::failure_message((AssertionResult *)0xea0f89);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea0fec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea105d);
  local_1fc = 0;
  lVar2 = in_RDI + 0x10;
  local_210 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
  ;
  local_208 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9e0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xea111f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea1182);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea11f0);
  local_234 = 1;
  local_240 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea120c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  line = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
  iVar6 = (int)((ulong)in_stack_fffffffffffff918 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9d8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xea1285);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,line,
               (char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xea12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea1359);
  lVar3 = in_RDI + 0x10;
  local_2a8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff920,iVar6);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff9b0);
  local_2b9 = google::
              sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff910,(bool *)in_stack_fffffffffffff908,
             (type *)0xea13ef);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar8,in_stack_fffffffffffff930,line,
               (char *)in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_340);
    testing::Message::~Message((Message *)0xea14c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea1559);
  lVar4 = in_RDI + 0x10;
  memcpy(&local_388,local_2a0,0x48);
  it_00.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9b8;
  it_00.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff9b0;
  it_00.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9c0;
  it_00.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)lVar4;
  it_00.pos.col_current = (const_nonempty_iterator)lVar3;
  it_00.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9d8;
  it_00.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9e0;
  it_00.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)lVar2;
  it_00.end.col_current = in_stack_fffffffffffff9f0;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff9a0,it_00);
  local_39c = 0;
  local_3a8 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea15ee);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_368,pcStack_370,local_378,(unsigned_long *)pHStack_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  uVar5 = local_388;
  this_00 = pHStack_380;
  lhs = local_378;
  rhs_expression = pcStack_370;
  lhs_expression = local_368;
  file = pcStack_360;
  uVar7 = local_358;
  this_01 = pAStack_350;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_350);
    testing::AssertionResult::failure_message((AssertionResult *)0xea1667);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_350,(Type)((ulong)local_358 >> 0x20),pcStack_360,
               (int)((ulong)local_368 >> 0x20),pcStack_370);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pHStack_380);
    testing::Message::~Message((Message *)0xea16ca);
    uVar5 = local_388;
    this_00 = pHStack_380;
    lhs = local_378;
    rhs_expression = pcStack_370;
    lhs_expression = local_368;
    file = pcStack_360;
    uVar7 = local_358;
    this_01 = pAStack_350;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea1738);
  local_3bc = 10;
  while( true ) {
    TVar8 = (Type)((ulong)uVar7 >> 0x20);
    if (99 < local_3bc) break;
    local_3c8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_00,(int)((ulong)uVar5 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffa50,obj);
    local_3bc = local_3bc + 1;
  }
  local_434 = 0x5a;
  local_440 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea17d6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_00);
  iVar6 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff9b0 =
         (BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xea183d);
    testing::internal::AssertHelper::AssertHelper(this_01,TVar8,file,iVar6,rhs_expression);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xea18a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea1911);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff9b0);
  memcpy(local_498,local_4e8,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff9b0);
  memcpy(local_530,&stack0xfffffffffffffa80,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)obj;
  f.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_RDI;
  f.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa50;
  f.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa58;
  f.pos.col_current = (const_nonempty_iterator)in_stack_fffffffffffffa60;
  f.end.row_begin._M_current._0_4_ = in_stack_fffffffffffffa68;
  f.end.row_begin._M_current._4_4_ = in_stack_fffffffffffffa6c;
  f.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa70._0_8_;
  f.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa70._8_8_;
  f.end.col_current = (const_nonempty_iterator)in_stack_fffffffffffffa70._16_8_;
  TVar8 = TStack_464;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffa30,f,in_stack_fffffffffffffa88);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xea1a34);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_478,pcStack_480,local_488,(unsigned_long *)pAStack_490);
  iVar6 = (int)((ulong)local_478 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa70);
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_460);
    testing::AssertionResult::failure_message((AssertionResult *)0xea1aad);
    testing::internal::AssertHelper::AssertHelper(pAStack_460,TVar8,pcStack_470,iVar6,pcStack_480);
    testing::internal::AssertHelper::operator=(local_4f0,pMStack_4f8);
    testing::internal::AssertHelper::~AssertHelper(pAStack_490);
    testing::Message::~Message((Message *)0xea1b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea1b7b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}